

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ptls_openssl_signature_scheme_t *
ptls_openssl_select_signature_scheme
          (ptls_openssl_signature_scheme_t *available,uint16_t *algorithms,size_t num_algorithms)

{
  uint16_t *puVar1;
  ptls_openssl_signature_scheme_t *scheme;
  size_t sVar2;
  
  do {
    if (available->scheme_id == 0xffff) {
      return (ptls_openssl_signature_scheme_t *)0x0;
    }
    sVar2 = 0;
    while (num_algorithms != sVar2) {
      puVar1 = algorithms + sVar2;
      sVar2 = sVar2 + 1;
      if (*puVar1 == available->scheme_id) {
        return available;
      }
    }
    available = available + 1;
  } while( true );
}

Assistant:

const ptls_openssl_signature_scheme_t *ptls_openssl_select_signature_scheme(const ptls_openssl_signature_scheme_t *available,
                                                                            const uint16_t *algorithms, size_t num_algorithms)
{
    const ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm, driven by server-isde preference of `available` */
    for (scheme = available; scheme->scheme_id != UINT16_MAX; ++scheme)
        for (size_t i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                return scheme;

    return NULL;
}